

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

dtree_t * read_final_tree(FILE *fp,pset_t *pset,uint32 n_pset)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  undefined4 local_fc;
  int err;
  float32 occ;
  float64 ent;
  comp_quest_t *q;
  uint local_e0;
  uint32 node_id_n;
  uint32 node_id_y;
  uint32 node_id;
  uint32 i;
  uint32 n_scan;
  lineiter_t *ln;
  char str [128];
  char *s;
  void *pvStack_30;
  uint32 n_node;
  dtree_node_t *node;
  dtree_t *out;
  pset_t *ppStack_18;
  uint32 n_pset_local;
  pset_t *pset_local;
  FILE *fp_local;
  
  _i = (lineiter_t *)0x0;
  out._4_4_ = n_pset;
  ppStack_18 = pset;
  pset_local = (pset_t *)fp;
  node = (dtree_node_t *)
         __ckd_calloc__(1,0x10,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                        ,0x111);
  _i = lineiter_start_clean((FILE *)pset_local);
  pcVar3 = _i->buf;
  __isoc99_sscanf(pcVar3,"%s%n",&ln,&node_id);
  iVar2 = strcmp((char *)&ln,"n_node");
  if (iVar2 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
            ,0x11c,"Format error; expecting n_node\n");
    exit(1);
  }
  __isoc99_sscanf(pcVar3 + node_id,"%u",(long)&s + 4);
  *(uint *)&node->id = s._4_4_;
  pvStack_30 = __ckd_calloc__((ulong)s._4_4_,0x68,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                              ,0x120);
  *(void **)node = pvStack_30;
  for (node_id_y = 0; node_id_y < s._4_4_; node_id_y = node_id_y + 1) {
    *(uint32 *)((long)pvStack_30 + (ulong)node_id_y * 0x68) = node_id_y;
  }
  bVar1 = false;
  while (_i = lineiter_next(_i), _i != (lineiter_t *)0x0) {
    pcVar3 = _i->buf;
    __isoc99_sscanf(pcVar3,"%u%n",&node_id_n,&node_id);
    pcVar3 = pcVar3 + node_id;
    __isoc99_sscanf(pcVar3,"%s%n",&ln,&node_id);
    pcVar3 = pcVar3 + node_id;
    iVar2 = strcmp((char *)&ln,"-");
    if (iVar2 == 0) {
      local_e0 = 0xffffffff;
    }
    else {
      local_e0 = atoi((char *)&ln);
    }
    __isoc99_sscanf(pcVar3,"%s%n",&ln,&node_id);
    pcVar3 = pcVar3 + node_id;
    iVar2 = strcmp((char *)&ln,"-");
    if (iVar2 == 0) {
      q._4_4_ = 0xffffffff;
    }
    else {
      q._4_4_ = atoi((char *)&ln);
    }
    __isoc99_sscanf(pcVar3,"%le%n",&err,&node_id);
    uVar4 = (ulong)node_id;
    __isoc99_sscanf(pcVar3 + uVar4,"%e%n",&local_fc,&node_id);
    uVar5 = (ulong)node_id;
    if ((local_e0 == 0xffffffff) || (local_e0 == 0xffffffff)) {
      *(undefined8 *)((long)pvStack_30 + (ulong)node_id_n * 0x68 + 0x40) = 0;
    }
    else {
      ent = (float64)__ckd_calloc__(1,0x18,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                                    ,0x142);
      iVar2 = s3parse_comp_quest(ppStack_18,out._4_4_,(comp_quest_t *)ent,pcVar3 + uVar4 + uVar5);
      if (iVar2 != 0) {
        bVar1 = true;
      }
      *(float64 *)((long)pvStack_30 + (ulong)node_id_n * 0x68 + 0x40) = ent;
    }
    if ((local_e0 == 0xffffffff) || (local_e0 == 0xffffffff)) {
      *(undefined8 *)((long)pvStack_30 + (ulong)node_id_n * 0x68 + 0x38) = _err;
    }
    else {
      *(undefined8 *)((long)pvStack_30 + (ulong)node_id_n * 0x68 + 0x48) = _err;
    }
    *(undefined4 *)((long)pvStack_30 + (ulong)node_id_n * 0x68 + 0x30) = local_fc;
    if ((local_e0 == 0xffffffff) || (local_e0 == 0xffffffff)) {
      *(undefined8 *)((long)pvStack_30 + (ulong)node_id_n * 0x68 + 0x58) = 0;
      *(undefined8 *)((long)pvStack_30 + (ulong)node_id_n * 0x68 + 0x60) = 0;
    }
    else {
      *(void **)((long)pvStack_30 + (ulong)node_id_n * 0x68 + 0x58) =
           (void *)((long)pvStack_30 + (ulong)local_e0 * 0x68);
      *(void **)((long)pvStack_30 + (ulong)node_id_n * 0x68 + 0x60) =
           (void *)((long)pvStack_30 + (ulong)q._4_4_ * 0x68);
      pvVar6 = (void *)((long)pvStack_30 + (ulong)node_id_n * 0x68);
      *(void **)((long)pvStack_30 + (ulong)q._4_4_ * 0x68 + 0x50) = pvVar6;
      *(void **)((long)pvStack_30 + (ulong)local_e0 * 0x68 + 0x50) = pvVar6;
    }
  }
  if (bVar1) {
    free_tree((dtree_t *)node);
    node = (dtree_node_t *)0x0;
  }
  lineiter_free(_i);
  return (dtree_t *)node;
}

Assistant:

dtree_t *
read_final_tree(FILE *fp,
		pset_t *pset,
		uint32 n_pset)
{
    dtree_t *out;
    dtree_node_t *node;
    uint32  n_node;
    char *s, str[128];
    lineiter_t *ln = NULL;
    uint32 n_scan;
    uint32 i, node_id, node_id_y, node_id_n;
    comp_quest_t *q;
    float64 ent;
    float32 occ;
    int err;

    out = ckd_calloc(1, sizeof(dtree_t));

    ln = lineiter_start_clean(fp);
    
    s = ln->buf;
    sscanf(s, "%s%n", str, &n_scan);
    if (strcmp(str, "n_node") == 0) {
	s += n_scan;
	sscanf(s, "%u", &n_node);
    }
    else {
	E_FATAL("Format error; expecting n_node\n");
    }

    out->n_node = n_node;
    out->node = node = ckd_calloc(n_node, sizeof(dtree_node_t));

    for (i = 0; i < n_node; i++)
	node[i].node_id = i;
    
    err = FALSE;
    
    while ((ln = lineiter_next(ln))) {
	s = ln->buf;

	sscanf(s, "%u%n", &node_id, &n_scan);
	s += n_scan;
	sscanf(s, "%s%n", str, &n_scan);
	s += n_scan;
	if (strcmp(str, "-") == 0) {
	    node_id_y = NO_ID;
	}
	else {
	    node_id_y = atoi(str);
	}
	sscanf(s, "%s%n", str, &n_scan);
	s += n_scan;
	if (strcmp(str, "-") == 0) {
	    node_id_n = NO_ID;
	}
	else {
	    node_id_n = atoi(str);
	}
	sscanf(s, "%le%n", &ent, &n_scan);
	s += n_scan;
	sscanf(s, "%e%n", &occ, &n_scan);
	s += n_scan;

	if ((node_id_y != NO_ID) && (node_id_y != NO_ID)) {
	    q = (comp_quest_t *)ckd_calloc(1, sizeof(comp_quest_t));
	    if (s3parse_comp_quest(pset, n_pset, q, s) != S3_SUCCESS) {
		err = TRUE;
	    }

	    node[node_id].q = q;
	}
	else
	    node[node_id].q = NULL;

	/* ck if internal node */
	if ((node_id_y != NO_ID) && (node_id_y != NO_ID))
	    node[node_id].wt_ent_dec = ent;
	else
	    node[node_id].wt_ent = ent;

	node[node_id].occ = occ;

	if ((node_id_y != NO_ID) && (node_id_y != NO_ID)) {
	    node[node_id].y = &node[node_id_y];
	    node[node_id].n = &node[node_id_n];
	    node[node_id_y].p = node[node_id_n].p = &node[node_id];
	}
	else {
	    node[node_id].y = NULL;
	    node[node_id].n = NULL;
	}
    }

    if (err == TRUE) {
	free_tree(out);
	out = NULL;
    }

    lineiter_free(ln);
    return out;
}